

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::gui::CGUIEnvironment::SSpriteBank>::sort
          (array<irr::gui::CGUIEnvironment::SSpriteBank> *this)

{
  iterator __first;
  iterator __last;
  long in_RDI;
  vector<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
  *in_stack_ffffffffffffffd8;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    __first = std::
              vector<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
              ::begin(in_stack_ffffffffffffffd8);
    __last = std::
             vector<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
             ::end(in_stack_ffffffffffffffd8);
    ::std::
    sort<__gnu_cxx::__normal_iterator<irr::gui::CGUIEnvironment::SSpriteBank*,std::vector<irr::gui::CGUIEnvironment::SSpriteBank,std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>>>>
              ((__normal_iterator<irr::gui::CGUIEnvironment::SSpriteBank_*,_std::vector<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>_>
                )__first._M_current,
               (__normal_iterator<irr::gui::CGUIEnvironment::SSpriteBank_*,_std::vector<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>_>
                )__last._M_current);
    *(undefined1 *)(in_RDI + 0x18) = 1;
  }
  return;
}

Assistant:

void sort()
	{
		if (!is_sorted) {
			std::sort(m_data.begin(), m_data.end());
			is_sorted = true;
		}
	}